

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_genericmodel.cpp
# Opt level: O2

void __thiscall tst_GenericModel::moveColumnsTable(tst_GenericModel *this)

{
  long lVar1;
  char cVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  ModelTest *this_00;
  QArrayDataPointer<QVariant> *pQVar7;
  long lVar8;
  value_type args;
  QModelIndex local_200;
  QArrayDataPointer<char16_t> local_1e8;
  QArrayDataPointer<char16_t> local_1d0;
  QModelIndex local_1b8;
  GenericModel testModel;
  QArrayDataPointer<char16_t> local_188;
  long local_168;
  QPersistentModelIndex oneTwoIndex;
  QSignalSpy *spyArr [2];
  QPersistentModelIndex oneOneIndex;
  ModelTest probe;
  QSignalSpy rowsAboutToBeMovedSpy;
  QSignalSpy columnsMovedSpy;
  
  GenericModel::GenericModel(&testModel,(QObject *)0x0);
  this_00 = &probe;
  ModelTest::ModelTest(this_00,(QAbstractItemModel *)&testModel,(QObject *)0x0);
  rowsAboutToBeMovedSpy.super_QObject = (QObject)0xff;
  rowsAboutToBeMovedSpy._1_7_ = 0xffffffffffffff;
  rowsAboutToBeMovedSpy._8_8_ = 0;
  rowsAboutToBeMovedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
  fillTable((tst_GenericModel *)this_00,(QAbstractItemModel *)&testModel,2,6,
            (QModelIndex *)&rowsAboutToBeMovedSpy,0);
  QSignalSpy::QSignalSpy
            (&rowsAboutToBeMovedSpy,(QObject *)&testModel,
             "2columnsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)");
  cVar2 = QTest::qVerify(rowsAboutToBeMovedSpy.sig.d.size != 0,"rowsAboutToBeMovedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x7df);
  if (cVar2 == '\0') goto LAB_00127a88;
  QSignalSpy::QSignalSpy
            (&columnsMovedSpy,(QObject *)&testModel,
             "2columnsMoved(QModelIndex, int, int, QModelIndex, int)");
  cVar2 = QTest::qVerify(columnsMovedSpy.sig.d.size != 0,"columnsMovedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x7e1);
  if (cVar2 != '\0') {
    args.d.d = (Data *)0xffffffffffffffff;
    args.d.ptr = (QVariant *)0x0;
    args.d.size = 0;
    local_200.r = -1;
    local_200.c = -1;
    local_200.i = 0;
    local_200.m = (QAbstractItemModel *)0x0;
    spyArr[0] = &rowsAboutToBeMovedSpy;
    spyArr[1] = &columnsMovedSpy;
    bVar3 = GenericModel::moveColumns
                      ((QModelIndex *)&testModel,(int)&args,2,(QModelIndex *)0x1,(int)&local_200);
    cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),
                           "!testModel.moveColumns(QModelIndex(), 2, 1, QModelIndex(), -1)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                           ,0x7e4);
    if (cVar2 != '\0') {
      lVar8 = 0;
      do {
        if (lVar8 == 0x10) {
          args.d.d = (Data *)0xffffffffffffffff;
          args.d.ptr = (QVariant *)0x0;
          args.d.size = 0;
          local_200.r = -1;
          local_200.c = -1;
          local_200.i = 0;
          local_200.m = (QAbstractItemModel *)0x0;
          bVar3 = GenericModel::moveColumns
                            ((QModelIndex *)&testModel,(int)&args,2,(QModelIndex *)0x1,
                             (int)&local_200);
          cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),
                                 "!testModel.moveColumns(QModelIndex(), 2, 1, QModelIndex(), 7)","",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                 ,0x7e7);
          if (cVar2 != '\0') {
            lVar8 = 0;
            goto LAB_001249ce;
          }
          break;
        }
        cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar8) + 0x20),0,
                                "spy->count()","0",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                ,0x7e6);
        lVar8 = lVar8 + 8;
      } while (cVar2 != '\0');
    }
  }
  goto LAB_00127a7b;
  while( true ) {
    cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar8) + 0x20),0,"spy->count()",
                            "0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x7e9);
    lVar8 = lVar8 + 8;
    if (cVar2 == '\0') break;
LAB_001249ce:
    if (lVar8 == 0x10) {
      args.d.d = (Data *)0xffffffffffffffff;
      args.d.ptr = (QVariant *)0x0;
      args.d.size = 0;
      local_200.r = -1;
      local_200.c = -1;
      local_200.i = 0;
      local_200.m = (QAbstractItemModel *)0x0;
      bVar3 = GenericModel::moveColumns
                        ((QModelIndex *)&testModel,(int)&args,-1,(QModelIndex *)0x1,(int)&local_200)
      ;
      cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),
                             "!testModel.moveColumns(QModelIndex(), -1, 1, QModelIndex(), 3)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x7ea);
      if (cVar2 != '\0') {
        lVar8 = 0;
        goto LAB_00124a7d;
      }
      break;
    }
  }
  goto LAB_00127a7b;
  while( true ) {
    cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar8) + 0x20),0,"spy->count()",
                            "0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x7ec);
    lVar8 = lVar8 + 8;
    if (cVar2 == '\0') break;
LAB_00124a7d:
    if (lVar8 == 0x10) {
      args.d.d = (Data *)0xffffffffffffffff;
      args.d.ptr = (QVariant *)0x0;
      args.d.size = 0;
      local_200.r = -1;
      local_200.c = -1;
      local_200.i = 0;
      local_200.m = (QAbstractItemModel *)0x0;
      bVar3 = GenericModel::moveColumns
                        ((QModelIndex *)&testModel,(int)&args,6,(QModelIndex *)0x1,(int)&local_200);
      cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),
                             "!testModel.moveColumns(QModelIndex(), 6, 1, QModelIndex(), 3)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x7ed);
      if (cVar2 != '\0') {
        lVar8 = 0;
        goto LAB_00124b2c;
      }
      break;
    }
  }
  goto LAB_00127a7b;
  while( true ) {
    cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar8) + 0x20),0,"spy->count()",
                            "0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x7ef);
    lVar8 = lVar8 + 8;
    if (cVar2 == '\0') break;
LAB_00124b2c:
    if (lVar8 == 0x10) {
      args.d.d = (Data *)0xffffffffffffffff;
      args.d.ptr = (QVariant *)0x0;
      args.d.size = 0;
      local_200.r = -1;
      local_200.c = -1;
      local_200.i = 0;
      local_200.m = (QAbstractItemModel *)0x0;
      bVar3 = GenericModel::moveColumns
                        ((QModelIndex *)&testModel,(int)&args,1,(QModelIndex *)0x2,(int)&local_200);
      cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),
                             "!testModel.moveColumns(QModelIndex(), 1, 2, QModelIndex(), 2)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x7f0);
      if (cVar2 != '\0') {
        lVar8 = 0;
        goto LAB_00124bda;
      }
      break;
    }
  }
  goto LAB_00127a7b;
  while( true ) {
    cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar8) + 0x20),0,"spy->count()",
                            "0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x7f2);
    lVar8 = lVar8 + 8;
    if (cVar2 == '\0') break;
LAB_00124bda:
    if (lVar8 == 0x10) {
      args.d.d = (Data *)0xffffffffffffffff;
      args.d.ptr = (QVariant *)0x0;
      args.d.size = 0;
      local_200.r = -1;
      local_200.c = -1;
      local_200.i = 0;
      local_200.m = (QAbstractItemModel *)0x0;
      bVar3 = GenericModel::moveColumns
                        ((QModelIndex *)&testModel,(int)&args,1,(QModelIndex *)0x2,(int)&local_200);
      cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),
                             "!testModel.moveColumns(QModelIndex(), 1, 2, QModelIndex(), 3)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x7f3);
      if (cVar2 != '\0') {
        lVar8 = 0;
        goto LAB_00124c89;
      }
      break;
    }
  }
  goto LAB_00127a7b;
  while( true ) {
    cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar8) + 0x20),0,"spy->count()",
                            "0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x7f5);
    lVar8 = lVar8 + 8;
    if (cVar2 == '\0') break;
LAB_00124c89:
    if (lVar8 == 0x10) {
      local_200.r = -1;
      local_200.c = -1;
      local_200.i = 0;
      local_200.m = (QAbstractItemModel *)0x0;
      GenericModel::index((int)&args,(int)&testModel,(QModelIndex *)0x1);
      QPersistentModelIndex::QPersistentModelIndex(&oneTwoIndex,(QModelIndex *)&args);
      args.d.d = (Data *)0xffffffffffffffff;
      args.d.ptr = (QVariant *)0x0;
      args.d.size = 0;
      local_200.r = -1;
      local_200.c = -1;
      local_200.i = 0;
      local_200.m = (QAbstractItemModel *)0x0;
      bVar4 = (bool)GenericModel::moveColumns
                              ((QModelIndex *)&testModel,(int)&args,2,(QModelIndex *)0x1,
                               (int)&local_200);
      cVar2 = QTest::qVerify(bVar4,"testModel.moveColumns(QModelIndex(), 2, 1, QModelIndex(), 4)",""
                             ,
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x7f8);
      if (cVar2 == '\0') goto LAB_00127a6e;
      local_188.d = (Data *)0xffffffffffffffff;
      local_188.ptr = (char16_t *)0x0;
      local_188.size = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x0);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      QVariant::toString();
      local_1d0.d = (Data *)0x0;
      local_1d0.ptr = L"0,0";
      local_1d0.size = 3;
      local_1e8.d = (Data *)0x0;
      local_1e8.ptr = (char16_t *)0x0;
      local_1e8.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                              "testModel.index(0, 0).data().toString()","QStringLiteral(\"0,0\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x7f9);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_200);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_00127a6e;
      local_188.d = (Data *)0xffffffffffffffff;
      local_188.ptr = (char16_t *)0x0;
      local_188.size = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x0);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      QVariant::toString();
      local_1d0.d = (Data *)0x0;
      local_1d0.ptr = L"0,1";
      local_1d0.size = 3;
      local_1e8.d = (Data *)0x0;
      local_1e8.ptr = (char16_t *)0x0;
      local_1e8.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                              "testModel.index(0, 1).data().toString()","QStringLiteral(\"0,1\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x7fa);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_200);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_00127a6e;
      local_188.d = (Data *)0xffffffffffffffff;
      local_188.ptr = (char16_t *)0x0;
      local_188.size = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x0);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      QVariant::toString();
      local_1d0.d = (Data *)0x0;
      local_1d0.ptr = L"0,3";
      local_1d0.size = 3;
      local_1e8.d = (Data *)0x0;
      local_1e8.ptr = (char16_t *)0x0;
      local_1e8.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                              "testModel.index(0, 2).data().toString()","QStringLiteral(\"0,3\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x7fb);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_200);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_00127a6e;
      local_188.d = (Data *)0xffffffffffffffff;
      local_188.ptr = (char16_t *)0x0;
      local_188.size = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x0);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      QVariant::toString();
      local_1d0.d = (Data *)0x0;
      local_1d0.ptr = L"0,2";
      local_1d0.size = 3;
      local_1e8.d = (Data *)0x0;
      local_1e8.ptr = (char16_t *)0x0;
      local_1e8.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                              "testModel.index(0, 3).data().toString()","QStringLiteral(\"0,2\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x7fc);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_200);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_00127a6e;
      local_188.d = (Data *)0xffffffffffffffff;
      local_188.ptr = (char16_t *)0x0;
      local_188.size = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x0);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      QVariant::toString();
      local_1d0.d = (Data *)0x0;
      local_1d0.ptr = L"0,4";
      local_1d0.size = 3;
      local_1e8.d = (Data *)0x0;
      local_1e8.ptr = (char16_t *)0x0;
      local_1e8.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                              "testModel.index(0, 4).data().toString()","QStringLiteral(\"0,4\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x7fd);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_200);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_00127a6e;
      local_188.d = (Data *)0xffffffffffffffff;
      local_188.ptr = (char16_t *)0x0;
      local_188.size = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x0);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      QVariant::toString();
      local_1d0.d = (Data *)0x0;
      local_1d0.ptr = L"0,5";
      local_1d0.size = 3;
      local_1e8.d = (Data *)0x0;
      local_1e8.ptr = (char16_t *)0x0;
      local_1e8.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                              "testModel.index(0, 5).data().toString()","QStringLiteral(\"0,5\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x7fe);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_200);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_00127a6e;
      local_188.d = (Data *)0xffffffffffffffff;
      local_188.ptr = (char16_t *)0x0;
      local_188.size = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x1);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      QVariant::toString();
      local_1d0.d = (Data *)0x0;
      local_1d0.ptr = L"1,0";
      local_1d0.size = 3;
      local_1e8.d = (Data *)0x0;
      local_1e8.ptr = (char16_t *)0x0;
      local_1e8.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                              "testModel.index(1, 0).data().toString()","QStringLiteral(\"1,0\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x7ff);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_200);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_00127a6e;
      local_188.d = (Data *)0xffffffffffffffff;
      local_188.ptr = (char16_t *)0x0;
      local_188.size = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x1);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      QVariant::toString();
      local_1d0.d = (Data *)0x0;
      local_1d0.ptr = L"1,1";
      local_1d0.size = 3;
      local_1e8.d = (Data *)0x0;
      local_1e8.ptr = (char16_t *)0x0;
      local_1e8.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                              "testModel.index(1, 1).data().toString()","QStringLiteral(\"1,1\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x800);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_200);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_00127a6e;
      local_188.d = (Data *)0xffffffffffffffff;
      local_188.ptr = (char16_t *)0x0;
      local_188.size = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x1);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      QVariant::toString();
      local_1d0.d = (Data *)0x0;
      local_1d0.ptr = L"1,3";
      local_1d0.size = 3;
      local_1e8.d = (Data *)0x0;
      local_1e8.ptr = (char16_t *)0x0;
      local_1e8.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                              "testModel.index(1, 2).data().toString()","QStringLiteral(\"1,3\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x801);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_200);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_00127a6e;
      local_188.d = (Data *)0xffffffffffffffff;
      local_188.ptr = (char16_t *)0x0;
      local_188.size = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x1);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      QVariant::toString();
      local_1d0.d = (Data *)0x0;
      local_1d0.ptr = L"1,2";
      local_1d0.size = 3;
      local_1e8.d = (Data *)0x0;
      local_1e8.ptr = (char16_t *)0x0;
      local_1e8.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                              "testModel.index(1, 3).data().toString()","QStringLiteral(\"1,2\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x802);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_200);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_00127a6e;
      local_188.d = (Data *)0xffffffffffffffff;
      local_188.ptr = (char16_t *)0x0;
      local_188.size = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x1);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      QVariant::toString();
      local_1d0.d = (Data *)0x0;
      local_1d0.ptr = L"1,4";
      local_1d0.size = 3;
      local_1e8.d = (Data *)0x0;
      local_1e8.ptr = (char16_t *)0x0;
      local_1e8.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                              "testModel.index(1, 4).data().toString()","QStringLiteral(\"1,4\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x803);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_200);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_00127a6e;
      local_188.d = (Data *)0xffffffffffffffff;
      local_188.ptr = (char16_t *)0x0;
      local_188.size = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x1);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      QVariant::toString();
      local_1d0.d = (Data *)0x0;
      local_1d0.ptr = L"1,5";
      local_1d0.size = 3;
      local_1e8.d = (Data *)0x0;
      local_1e8.ptr = (char16_t *)0x0;
      local_1e8.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                              "testModel.index(1, 5).data().toString()","QStringLiteral(\"1,5\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x804);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_200);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_00127a6e;
      GenericModel::headerData((int)&args,(Orientation)&testModel,0);
      iVar5 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar5,0,"testModel.headerData(0, Qt::Horizontal).toInt()","0",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x805);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_00127a6e;
      GenericModel::headerData((int)&args,(Orientation)&testModel,1);
      iVar5 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar5,1,"testModel.headerData(1, Qt::Horizontal).toInt()","1",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x806);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_00127a6e;
      GenericModel::headerData((int)&args,(Orientation)&testModel,2);
      iVar5 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar5,3,"testModel.headerData(2, Qt::Horizontal).toInt()","3",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x807);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_00127a6e;
      GenericModel::headerData((int)&args,(Orientation)&testModel,3);
      iVar5 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar5,2,"testModel.headerData(3, Qt::Horizontal).toInt()","2",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x808);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_00127a6e;
      GenericModel::headerData((int)&args,(Orientation)&testModel,4);
      iVar5 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar5,4,"testModel.headerData(4, Qt::Horizontal).toInt()","4",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x809);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_00127a6e;
      GenericModel::headerData((int)&args,(Orientation)&testModel,5);
      iVar5 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar5,5,"testModel.headerData(5, Qt::Horizontal).toInt()","5",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x80a);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_00127a6e;
      QPersistentModelIndex::data((int)&args);
      QVariant::toString();
      local_1b8.r = 0;
      local_1b8.c = 0;
      local_1b8.i = 0x14a994;
      local_1b8.m = (QAbstractItemModel *)0x3;
      local_188.d = (Data *)0x0;
      local_188.ptr = (char16_t *)0x0;
      local_188.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1b8,
                              "oneTwoIndex.data().toString()","QStringLiteral(\"1,2\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x80b);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_188);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_200);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_00127a6e;
      uVar6 = QPersistentModelIndex::column();
      pQVar7 = (QArrayDataPointer<QVariant> *)(ulong)uVar6;
      cVar2 = QTest::qCompare(uVar6,3,"oneTwoIndex.column()","3",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x80c);
      if (cVar2 == '\0') goto LAB_00127a6e;
      local_168 = 0;
      goto LAB_00125a1c;
    }
  }
  goto LAB_00127a7b;
  while( true ) {
    lVar8 = *(long *)((long)spyArr + local_168);
    cVar2 = QTest::qCompare(*(longlong *)(lVar8 + 0x20),1,"spy->count()","1",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x80e);
    if (cVar2 == '\0') break;
    QList<QList<QVariant>_>::takeFirst(&args,(QList<QList<QVariant>_> *)(lVar8 + 0x10));
    qvariant_cast<QModelIndex>(&local_200,args.d.ptr);
    bVar4 = true;
    if ((-1 < local_200.r) && (-1 < (long)local_200._0_8_)) {
      bVar4 = local_200.m == (QAbstractItemModel *)0x0;
    }
    cVar2 = QTest::qVerify(bVar4,"!args.at(0).value<QModelIndex>().isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                           ,0x810);
    if (cVar2 == '\0') goto LAB_00127a64;
    iVar5 = QVariant::toInt((bool *)(args.d.ptr + 1));
    cVar2 = QTest::qCompare(iVar5,2,"args.at(1).toInt()","2",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x811);
    if (cVar2 == '\0') goto LAB_00127a64;
    iVar5 = QVariant::toInt((bool *)(args.d.ptr + 2));
    cVar2 = QTest::qCompare(iVar5,2,"args.at(2).toInt()","2",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x812);
    if (cVar2 == '\0') goto LAB_00127a64;
    qvariant_cast<QModelIndex>(&local_200,args.d.ptr + 3);
    bVar4 = true;
    if ((-1 < local_200.r) && (-1 < (long)local_200._0_8_)) {
      bVar4 = local_200.m == (QAbstractItemModel *)0x0;
    }
    cVar2 = QTest::qVerify(bVar4,"!args.at(3).value<QModelIndex>().isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                           ,0x813);
    if (cVar2 == '\0') goto LAB_00127a64;
    iVar5 = QVariant::toInt((bool *)(args.d.ptr + 4));
    cVar2 = QTest::qCompare(iVar5,4,"args.at(4).toInt()","4",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x814);
    pQVar7 = &args.d;
    QArrayDataPointer<QVariant>::~QArrayDataPointer(pQVar7);
    local_168 = local_168 + 8;
    if (cVar2 == '\0') break;
LAB_00125a1c:
    if (local_168 == 0x10) {
      args.d.d = (Data *)0xffffffffffffffff;
      args.d.ptr = (QVariant *)0x0;
      args.d.size = 0;
      fillTable((tst_GenericModel *)pQVar7,(QAbstractItemModel *)&testModel,2,6,(QModelIndex *)&args
                ,0);
      local_200.r = -1;
      local_200.c = -1;
      local_200.i = 0;
      local_200.m = (QAbstractItemModel *)0x0;
      GenericModel::index((int)&args,(int)&testModel,(QModelIndex *)0x1);
      QPersistentModelIndex::operator=(&oneTwoIndex,(QModelIndex *)&args);
      args.d.d = (Data *)0xffffffffffffffff;
      args.d.ptr = (QVariant *)0x0;
      args.d.size = 0;
      local_200.r = -1;
      local_200.c = -1;
      local_200.i = 0;
      local_200.m = (QAbstractItemModel *)0x0;
      bVar4 = (bool)GenericModel::moveColumns
                              ((QModelIndex *)&testModel,(int)&args,2,(QModelIndex *)0x1,
                               (int)&local_200);
      cVar2 = QTest::qVerify(bVar4,"testModel.moveColumns(QModelIndex(), 2, 1, QModelIndex(), 0)",""
                             ,
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x819);
      if (cVar2 != '\0') {
        local_188.d = (Data *)0xffffffffffffffff;
        local_188.ptr = (char16_t *)0x0;
        local_188.size = 0;
        GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x0);
        QModelIndex::data((QVariant *)&args,&local_1b8,0);
        QVariant::toString();
        local_1d0.d = (Data *)0x0;
        local_1d0.ptr = L"0,2";
        local_1d0.size = 3;
        local_1e8.d = (Data *)0x0;
        local_1e8.ptr = (char16_t *)0x0;
        local_1e8.size = 0;
        bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                                "testModel.index(0, 0).data().toString()","QStringLiteral(\"0,2\")",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                ,0x81a);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_200);
        QVariant::~QVariant((QVariant *)&args);
        if (bVar4) {
          local_188.d = (Data *)0xffffffffffffffff;
          local_188.ptr = (char16_t *)0x0;
          local_188.size = 0;
          GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x0);
          QModelIndex::data((QVariant *)&args,&local_1b8,0);
          QVariant::toString();
          local_1d0.d = (Data *)0x0;
          local_1d0.ptr = L"0,0";
          local_1d0.size = 3;
          local_1e8.d = (Data *)0x0;
          local_1e8.ptr = (char16_t *)0x0;
          local_1e8.size = 0;
          bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                                  "testModel.index(0, 1).data().toString()",
                                  "QStringLiteral(\"0,0\")",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                  ,0x81b);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_200)
          ;
          QVariant::~QVariant((QVariant *)&args);
          if (bVar4) {
            local_188.d = (Data *)0xffffffffffffffff;
            local_188.ptr = (char16_t *)0x0;
            local_188.size = 0;
            GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x0);
            QModelIndex::data((QVariant *)&args,&local_1b8,0);
            QVariant::toString();
            local_1d0.d = (Data *)0x0;
            local_1d0.ptr = L"0,1";
            local_1d0.size = 3;
            local_1e8.d = (Data *)0x0;
            local_1e8.ptr = (char16_t *)0x0;
            local_1e8.size = 0;
            bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                                    "testModel.index(0, 2).data().toString()",
                                    "QStringLiteral(\"0,1\")",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                    ,0x81c);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_200);
            QVariant::~QVariant((QVariant *)&args);
            if (bVar4) {
              local_188.d = (Data *)0xffffffffffffffff;
              local_188.ptr = (char16_t *)0x0;
              local_188.size = 0;
              GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x0);
              QModelIndex::data((QVariant *)&args,&local_1b8,0);
              QVariant::toString();
              local_1d0.d = (Data *)0x0;
              local_1d0.ptr = L"0,3";
              local_1d0.size = 3;
              local_1e8.d = (Data *)0x0;
              local_1e8.ptr = (char16_t *)0x0;
              local_1e8.size = 0;
              bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                                      "testModel.index(0, 3).data().toString()",
                                      "QStringLiteral(\"0,3\")",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                      ,0x81d);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_200);
              QVariant::~QVariant((QVariant *)&args);
              if (bVar4) {
                local_188.d = (Data *)0xffffffffffffffff;
                local_188.ptr = (char16_t *)0x0;
                local_188.size = 0;
                GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x0);
                QModelIndex::data((QVariant *)&args,&local_1b8,0);
                QVariant::toString();
                local_1d0.d = (Data *)0x0;
                local_1d0.ptr = L"0,4";
                local_1d0.size = 3;
                local_1e8.d = (Data *)0x0;
                local_1e8.ptr = (char16_t *)0x0;
                local_1e8.size = 0;
                bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                                        "testModel.index(0, 4).data().toString()",
                                        "QStringLiteral(\"0,4\")",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                        ,0x81e);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_200);
                QVariant::~QVariant((QVariant *)&args);
                if (bVar4) {
                  local_188.d = (Data *)0xffffffffffffffff;
                  local_188.ptr = (char16_t *)0x0;
                  local_188.size = 0;
                  GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x0);
                  QModelIndex::data((QVariant *)&args,&local_1b8,0);
                  QVariant::toString();
                  local_1d0.d = (Data *)0x0;
                  local_1d0.ptr = L"0,5";
                  local_1d0.size = 3;
                  local_1e8.d = (Data *)0x0;
                  local_1e8.ptr = (char16_t *)0x0;
                  local_1e8.size = 0;
                  bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                                          "testModel.index(0, 5).data().toString()",
                                          "QStringLiteral(\"0,5\")",
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                          ,0x81f);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_200);
                  QVariant::~QVariant((QVariant *)&args);
                  if (bVar4) {
                    local_188.d = (Data *)0xffffffffffffffff;
                    local_188.ptr = (char16_t *)0x0;
                    local_188.size = 0;
                    GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x1);
                    QModelIndex::data((QVariant *)&args,&local_1b8,0);
                    QVariant::toString();
                    local_1d0.d = (Data *)0x0;
                    local_1d0.ptr = L"1,2";
                    local_1d0.size = 3;
                    local_1e8.d = (Data *)0x0;
                    local_1e8.ptr = (char16_t *)0x0;
                    local_1e8.size = 0;
                    bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                                            "testModel.index(1, 0).data().toString()",
                                            "QStringLiteral(\"1,2\")",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                            ,0x820);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)&local_200);
                    QVariant::~QVariant((QVariant *)&args);
                    if (bVar4) {
                      local_188.d = (Data *)0xffffffffffffffff;
                      local_188.ptr = (char16_t *)0x0;
                      local_188.size = 0;
                      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x1);
                      QModelIndex::data((QVariant *)&args,&local_1b8,0);
                      QVariant::toString();
                      local_1d0.d = (Data *)0x0;
                      local_1d0.ptr = L"1,0";
                      local_1d0.size = 3;
                      local_1e8.d = (Data *)0x0;
                      local_1e8.ptr = (char16_t *)0x0;
                      local_1e8.size = 0;
                      bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                                              "testModel.index(1, 1).data().toString()",
                                              "QStringLiteral(\"1,0\")",
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                              ,0x821);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer
                                ((QArrayDataPointer<char16_t> *)&local_200);
                      QVariant::~QVariant((QVariant *)&args);
                      if (bVar4) {
                        local_188.d = (Data *)0xffffffffffffffff;
                        local_188.ptr = (char16_t *)0x0;
                        local_188.size = 0;
                        GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x1);
                        QModelIndex::data((QVariant *)&args,&local_1b8,0);
                        QVariant::toString();
                        local_1d0.d = (Data *)0x0;
                        local_1d0.ptr = L"1,1";
                        local_1d0.size = 3;
                        local_1e8.d = (Data *)0x0;
                        local_1e8.ptr = (char16_t *)0x0;
                        local_1e8.size = 0;
                        bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                                                "testModel.index(1, 2).data().toString()",
                                                "QStringLiteral(\"1,1\")",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                ,0x822);
                        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
                        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
                        QArrayDataPointer<char16_t>::~QArrayDataPointer
                                  ((QArrayDataPointer<char16_t> *)&local_200);
                        QVariant::~QVariant((QVariant *)&args);
                        if (bVar4) {
                          local_188.d = (Data *)0xffffffffffffffff;
                          local_188.ptr = (char16_t *)0x0;
                          local_188.size = 0;
                          GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x1);
                          QModelIndex::data((QVariant *)&args,&local_1b8,0);
                          QVariant::toString();
                          local_1d0.d = (Data *)0x0;
                          local_1d0.ptr = L"1,3";
                          local_1d0.size = 3;
                          local_1e8.d = (Data *)0x0;
                          local_1e8.ptr = (char16_t *)0x0;
                          local_1e8.size = 0;
                          bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                                                  "testModel.index(1, 3).data().toString()",
                                                  "QStringLiteral(\"1,3\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x823);
                          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
                          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
                          QArrayDataPointer<char16_t>::~QArrayDataPointer
                                    ((QArrayDataPointer<char16_t> *)&local_200);
                          QVariant::~QVariant((QVariant *)&args);
                          if (bVar4) {
                            local_188.d = (Data *)0xffffffffffffffff;
                            local_188.ptr = (char16_t *)0x0;
                            local_188.size = 0;
                            GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x1);
                            QModelIndex::data((QVariant *)&args,&local_1b8,0);
                            QVariant::toString();
                            local_1d0.d = (Data *)0x0;
                            local_1d0.ptr = L"1,4";
                            local_1d0.size = 3;
                            local_1e8.d = (Data *)0x0;
                            local_1e8.ptr = (char16_t *)0x0;
                            local_1e8.size = 0;
                            bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                                                    "testModel.index(1, 4).data().toString()",
                                                    "QStringLiteral(\"1,4\")",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x824);
                            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
                            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
                            QArrayDataPointer<char16_t>::~QArrayDataPointer
                                      ((QArrayDataPointer<char16_t> *)&local_200);
                            QVariant::~QVariant((QVariant *)&args);
                            if (bVar4) {
                              local_188.d = (Data *)0xffffffffffffffff;
                              local_188.ptr = (char16_t *)0x0;
                              local_188.size = 0;
                              GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x1
                                                 );
                              QModelIndex::data((QVariant *)&args,&local_1b8,0);
                              QVariant::toString();
                              local_1d0.d = (Data *)0x0;
                              local_1d0.ptr = L"1,5";
                              local_1d0.size = 3;
                              local_1e8.d = (Data *)0x0;
                              local_1e8.ptr = (char16_t *)0x0;
                              local_1e8.size = 0;
                              bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                                                      "testModel.index(1, 5).data().toString()",
                                                      "QStringLiteral(\"1,5\")",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x825);
                              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
                              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
                              QArrayDataPointer<char16_t>::~QArrayDataPointer
                                        ((QArrayDataPointer<char16_t> *)&local_200);
                              QVariant::~QVariant((QVariant *)&args);
                              if (bVar4) {
                                GenericModel::headerData((int)&args,(Orientation)&testModel,0);
                                iVar5 = QVariant::toInt((bool *)&args);
                                cVar2 = QTest::qCompare(iVar5,2,
                                                  "testModel.headerData(0, Qt::Horizontal).toInt()",
                                                  "2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x826);
                                QVariant::~QVariant((QVariant *)&args);
                                if (cVar2 != '\0') {
                                  GenericModel::headerData((int)&args,(Orientation)&testModel,1);
                                  iVar5 = QVariant::toInt((bool *)&args);
                                  cVar2 = QTest::qCompare(iVar5,0,
                                                  "testModel.headerData(1, Qt::Horizontal).toInt()",
                                                  "0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x827);
                                  QVariant::~QVariant((QVariant *)&args);
                                  if (cVar2 != '\0') {
                                    GenericModel::headerData((int)&args,(Orientation)&testModel,2);
                                    iVar5 = QVariant::toInt((bool *)&args);
                                    cVar2 = QTest::qCompare(iVar5,1,
                                                  "testModel.headerData(2, Qt::Horizontal).toInt()",
                                                  "1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x828);
                                    QVariant::~QVariant((QVariant *)&args);
                                    if (cVar2 != '\0') {
                                      GenericModel::headerData((int)&args,(Orientation)&testModel,3)
                                      ;
                                      iVar5 = QVariant::toInt((bool *)&args);
                                      cVar2 = QTest::qCompare(iVar5,3,
                                                  "testModel.headerData(3, Qt::Horizontal).toInt()",
                                                  "3",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x829);
                                      QVariant::~QVariant((QVariant *)&args);
                                      if (cVar2 != '\0') {
                                        GenericModel::headerData
                                                  ((int)&args,(Orientation)&testModel,4);
                                        iVar5 = QVariant::toInt((bool *)&args);
                                        cVar2 = QTest::qCompare(iVar5,4,
                                                  "testModel.headerData(4, Qt::Horizontal).toInt()",
                                                  "4",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x82a);
                                        QVariant::~QVariant((QVariant *)&args);
                                        if (cVar2 != '\0') {
                                          GenericModel::headerData
                                                    ((int)&args,(Orientation)&testModel,5);
                                          iVar5 = QVariant::toInt((bool *)&args);
                                          cVar2 = QTest::qCompare(iVar5,5,
                                                  "testModel.headerData(5, Qt::Horizontal).toInt()",
                                                  "5",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x82b);
                                          QVariant::~QVariant((QVariant *)&args);
                                          if (cVar2 != '\0') {
                                            QPersistentModelIndex::data((int)&args);
                                            QVariant::toString();
                                            local_1b8.r = 0;
                                            local_1b8.c = 0;
                                            local_1b8.i = 0x14a994;
                                            local_1b8.m = (QAbstractItemModel *)0x3;
                                            local_188.d = (Data *)0x0;
                                            local_188.ptr = (char16_t *)0x0;
                                            local_188.size = 0;
                                            bVar4 = QTest::qCompare((QString *)&local_200,
                                                                    (QString *)&local_1b8,
                                                                    "oneTwoIndex.data().toString()",
                                                                    "QStringLiteral(\"1,2\")",
                                                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x82c);
                                            QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                      ((QArrayDataPointer<char16_t> *)&local_1b8);
                                            QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                      (&local_188);
                                            QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                      ((QArrayDataPointer<char16_t> *)&local_200);
                                            QVariant::~QVariant((QVariant *)&args);
                                            if (bVar4) {
                                              uVar6 = QPersistentModelIndex::column();
                                              pQVar7 = (QArrayDataPointer<QVariant> *)(ulong)uVar6;
                                              cVar2 = QTest::qCompare(uVar6,0,"oneTwoIndex.column()"
                                                                      ,"0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x82d);
                                              if (cVar2 != '\0') {
                                                local_168 = 0;
                                                goto LAB_00126956;
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      break;
    }
  }
  goto LAB_00127a6e;
  while( true ) {
    lVar8 = *(long *)((long)spyArr + local_168);
    cVar2 = QTest::qCompare(*(longlong *)(lVar8 + 0x20),1,"spy->count()","1",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x82f);
    if (cVar2 == '\0') break;
    QList<QList<QVariant>_>::takeFirst(&args,(QList<QList<QVariant>_> *)(lVar8 + 0x10));
    qvariant_cast<QModelIndex>(&local_200,args.d.ptr);
    bVar4 = true;
    if ((-1 < local_200.r) && (-1 < (long)local_200._0_8_)) {
      bVar4 = local_200.m == (QAbstractItemModel *)0x0;
    }
    cVar2 = QTest::qVerify(bVar4,"!args.at(0).value<QModelIndex>().isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                           ,0x831);
    if (cVar2 == '\0') goto LAB_00127a64;
    iVar5 = QVariant::toInt((bool *)(args.d.ptr + 1));
    cVar2 = QTest::qCompare(iVar5,2,"args.at(1).toInt()","2",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x832);
    if (cVar2 == '\0') goto LAB_00127a64;
    iVar5 = QVariant::toInt((bool *)(args.d.ptr + 2));
    cVar2 = QTest::qCompare(iVar5,2,"args.at(2).toInt()","2",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x833);
    if (cVar2 == '\0') goto LAB_00127a64;
    qvariant_cast<QModelIndex>(&local_200,args.d.ptr + 3);
    bVar4 = true;
    if ((-1 < local_200.r) && (-1 < (long)local_200._0_8_)) {
      bVar4 = local_200.m == (QAbstractItemModel *)0x0;
    }
    cVar2 = QTest::qVerify(bVar4,"!args.at(3).value<QModelIndex>().isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                           ,0x834);
    if (cVar2 == '\0') goto LAB_00127a64;
    iVar5 = QVariant::toInt((bool *)(args.d.ptr + 4));
    cVar2 = QTest::qCompare(iVar5,0,"args.at(4).toInt()","0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x835);
    pQVar7 = &args.d;
    QArrayDataPointer<QVariant>::~QArrayDataPointer(pQVar7);
    local_168 = local_168 + 8;
    if (cVar2 == '\0') break;
LAB_00126956:
    if (local_168 == 0x10) {
      args.d.d = (Data *)0xffffffffffffffff;
      args.d.ptr = (QVariant *)0x0;
      args.d.size = 0;
      fillTable((tst_GenericModel *)pQVar7,(QAbstractItemModel *)&testModel,2,6,(QModelIndex *)&args
                ,0);
      local_200.r = -1;
      local_200.c = -1;
      local_200.i = 0;
      local_200.m = (QAbstractItemModel *)0x0;
      GenericModel::index((int)&args,(int)&testModel,(QModelIndex *)0x1);
      QPersistentModelIndex::operator=(&oneTwoIndex,(QModelIndex *)&args);
      args.d.d = (Data *)0xffffffffffffffff;
      args.d.ptr = (QVariant *)0x0;
      args.d.size = 0;
      local_200.r = -1;
      local_200.c = -1;
      local_200.i = 0;
      local_200.m = (QAbstractItemModel *)0x0;
      bVar4 = (bool)GenericModel::moveColumns
                              ((QModelIndex *)&testModel,(int)&args,2,(QModelIndex *)0x1,
                               (int)&local_200);
      cVar2 = QTest::qVerify(bVar4,"testModel.moveColumns(QModelIndex(), 2, 1, QModelIndex(), 6)",""
                             ,
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x83a);
      if (cVar2 != '\0') {
        local_188.d = (Data *)0xffffffffffffffff;
        local_188.ptr = (char16_t *)0x0;
        local_188.size = 0;
        GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x0);
        QModelIndex::data((QVariant *)&args,&local_1b8,0);
        QVariant::toString();
        local_1d0.d = (Data *)0x0;
        local_1d0.ptr = L"0,0";
        local_1d0.size = 3;
        local_1e8.d = (Data *)0x0;
        local_1e8.ptr = (char16_t *)0x0;
        local_1e8.size = 0;
        bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                                "testModel.index(0, 0).data().toString()","QStringLiteral(\"0,0\")",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                ,0x83b);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_200);
        QVariant::~QVariant((QVariant *)&args);
        if (bVar4) {
          local_188.d = (Data *)0xffffffffffffffff;
          local_188.ptr = (char16_t *)0x0;
          local_188.size = 0;
          GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x0);
          QModelIndex::data((QVariant *)&args,&local_1b8,0);
          QVariant::toString();
          local_1d0.d = (Data *)0x0;
          local_1d0.ptr = L"0,1";
          local_1d0.size = 3;
          local_1e8.d = (Data *)0x0;
          local_1e8.ptr = (char16_t *)0x0;
          local_1e8.size = 0;
          bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                                  "testModel.index(0, 1).data().toString()",
                                  "QStringLiteral(\"0,1\")",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                  ,0x83c);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_200)
          ;
          QVariant::~QVariant((QVariant *)&args);
          if (bVar4) {
            local_188.d = (Data *)0xffffffffffffffff;
            local_188.ptr = (char16_t *)0x0;
            local_188.size = 0;
            GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x0);
            QModelIndex::data((QVariant *)&args,&local_1b8,0);
            QVariant::toString();
            local_1d0.d = (Data *)0x0;
            local_1d0.ptr = L"0,3";
            local_1d0.size = 3;
            local_1e8.d = (Data *)0x0;
            local_1e8.ptr = (char16_t *)0x0;
            local_1e8.size = 0;
            bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                                    "testModel.index(0, 2).data().toString()",
                                    "QStringLiteral(\"0,3\")",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                    ,0x83d);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_200);
            QVariant::~QVariant((QVariant *)&args);
            if (bVar4) {
              local_188.d = (Data *)0xffffffffffffffff;
              local_188.ptr = (char16_t *)0x0;
              local_188.size = 0;
              GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x0);
              QModelIndex::data((QVariant *)&args,&local_1b8,0);
              QVariant::toString();
              local_1d0.d = (Data *)0x0;
              local_1d0.ptr = L"0,4";
              local_1d0.size = 3;
              local_1e8.d = (Data *)0x0;
              local_1e8.ptr = (char16_t *)0x0;
              local_1e8.size = 0;
              bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                                      "testModel.index(0, 3).data().toString()",
                                      "QStringLiteral(\"0,4\")",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                      ,0x83e);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_200);
              QVariant::~QVariant((QVariant *)&args);
              if (bVar4) {
                local_188.d = (Data *)0xffffffffffffffff;
                local_188.ptr = (char16_t *)0x0;
                local_188.size = 0;
                GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x0);
                QModelIndex::data((QVariant *)&args,&local_1b8,0);
                QVariant::toString();
                local_1d0.d = (Data *)0x0;
                local_1d0.ptr = L"0,5";
                local_1d0.size = 3;
                local_1e8.d = (Data *)0x0;
                local_1e8.ptr = (char16_t *)0x0;
                local_1e8.size = 0;
                bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                                        "testModel.index(0, 4).data().toString()",
                                        "QStringLiteral(\"0,5\")",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                        ,0x83f);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_200);
                QVariant::~QVariant((QVariant *)&args);
                if (bVar4) {
                  local_188.d = (Data *)0xffffffffffffffff;
                  local_188.ptr = (char16_t *)0x0;
                  local_188.size = 0;
                  GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x0);
                  QModelIndex::data((QVariant *)&args,&local_1b8,0);
                  QVariant::toString();
                  local_1d0.d = (Data *)0x0;
                  local_1d0.ptr = L"0,2";
                  local_1d0.size = 3;
                  local_1e8.d = (Data *)0x0;
                  local_1e8.ptr = (char16_t *)0x0;
                  local_1e8.size = 0;
                  bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                                          "testModel.index(0, 5).data().toString()",
                                          "QStringLiteral(\"0,2\")",
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                          ,0x840);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_200);
                  QVariant::~QVariant((QVariant *)&args);
                  if (bVar4) {
                    local_188.d = (Data *)0xffffffffffffffff;
                    local_188.ptr = (char16_t *)0x0;
                    local_188.size = 0;
                    GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x1);
                    QModelIndex::data((QVariant *)&args,&local_1b8,0);
                    QVariant::toString();
                    local_1d0.d = (Data *)0x0;
                    local_1d0.ptr = L"1,0";
                    local_1d0.size = 3;
                    local_1e8.d = (Data *)0x0;
                    local_1e8.ptr = (char16_t *)0x0;
                    local_1e8.size = 0;
                    bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                                            "testModel.index(1, 0).data().toString()",
                                            "QStringLiteral(\"1,0\")",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                            ,0x841);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)&local_200);
                    QVariant::~QVariant((QVariant *)&args);
                    if (bVar4) {
                      local_188.d = (Data *)0xffffffffffffffff;
                      local_188.ptr = (char16_t *)0x0;
                      local_188.size = 0;
                      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x1);
                      QModelIndex::data((QVariant *)&args,&local_1b8,0);
                      QVariant::toString();
                      local_1d0.d = (Data *)0x0;
                      local_1d0.ptr = L"1,1";
                      local_1d0.size = 3;
                      local_1e8.d = (Data *)0x0;
                      local_1e8.ptr = (char16_t *)0x0;
                      local_1e8.size = 0;
                      bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                                              "testModel.index(1, 1).data().toString()",
                                              "QStringLiteral(\"1,1\")",
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                              ,0x842);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer
                                ((QArrayDataPointer<char16_t> *)&local_200);
                      QVariant::~QVariant((QVariant *)&args);
                      if (bVar4) {
                        local_188.d = (Data *)0xffffffffffffffff;
                        local_188.ptr = (char16_t *)0x0;
                        local_188.size = 0;
                        GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x1);
                        QModelIndex::data((QVariant *)&args,&local_1b8,0);
                        QVariant::toString();
                        local_1d0.d = (Data *)0x0;
                        local_1d0.ptr = L"1,3";
                        local_1d0.size = 3;
                        local_1e8.d = (Data *)0x0;
                        local_1e8.ptr = (char16_t *)0x0;
                        local_1e8.size = 0;
                        bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                                                "testModel.index(1, 2).data().toString()",
                                                "QStringLiteral(\"1,3\")",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                ,0x843);
                        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
                        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
                        QArrayDataPointer<char16_t>::~QArrayDataPointer
                                  ((QArrayDataPointer<char16_t> *)&local_200);
                        QVariant::~QVariant((QVariant *)&args);
                        if (bVar4) {
                          local_188.d = (Data *)0xffffffffffffffff;
                          local_188.ptr = (char16_t *)0x0;
                          local_188.size = 0;
                          GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x1);
                          QModelIndex::data((QVariant *)&args,&local_1b8,0);
                          QVariant::toString();
                          local_1d0.d = (Data *)0x0;
                          local_1d0.ptr = L"1,4";
                          local_1d0.size = 3;
                          local_1e8.d = (Data *)0x0;
                          local_1e8.ptr = (char16_t *)0x0;
                          local_1e8.size = 0;
                          bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                                                  "testModel.index(1, 3).data().toString()",
                                                  "QStringLiteral(\"1,4\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x844);
                          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
                          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
                          QArrayDataPointer<char16_t>::~QArrayDataPointer
                                    ((QArrayDataPointer<char16_t> *)&local_200);
                          QVariant::~QVariant((QVariant *)&args);
                          if (bVar4) {
                            local_188.d = (Data *)0xffffffffffffffff;
                            local_188.ptr = (char16_t *)0x0;
                            local_188.size = 0;
                            GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x1);
                            QModelIndex::data((QVariant *)&args,&local_1b8,0);
                            QVariant::toString();
                            local_1d0.d = (Data *)0x0;
                            local_1d0.ptr = L"1,5";
                            local_1d0.size = 3;
                            local_1e8.d = (Data *)0x0;
                            local_1e8.ptr = (char16_t *)0x0;
                            local_1e8.size = 0;
                            bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                                                    "testModel.index(1, 4).data().toString()",
                                                    "QStringLiteral(\"1,5\")",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x845);
                            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
                            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
                            QArrayDataPointer<char16_t>::~QArrayDataPointer
                                      ((QArrayDataPointer<char16_t> *)&local_200);
                            QVariant::~QVariant((QVariant *)&args);
                            if (bVar4) {
                              local_188.d = (Data *)0xffffffffffffffff;
                              local_188.ptr = (char16_t *)0x0;
                              local_188.size = 0;
                              GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x1
                                                 );
                              QModelIndex::data((QVariant *)&args,&local_1b8,0);
                              QVariant::toString();
                              local_1d0.d = (Data *)0x0;
                              local_1d0.ptr = L"1,2";
                              local_1d0.size = 3;
                              local_1e8.d = (Data *)0x0;
                              local_1e8.ptr = (char16_t *)0x0;
                              local_1e8.size = 0;
                              bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                                                      "testModel.index(1, 5).data().toString()",
                                                      "QStringLiteral(\"1,2\")",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x846);
                              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
                              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
                              QArrayDataPointer<char16_t>::~QArrayDataPointer
                                        ((QArrayDataPointer<char16_t> *)&local_200);
                              QVariant::~QVariant((QVariant *)&args);
                              if (bVar4) {
                                GenericModel::headerData((int)&args,(Orientation)&testModel,0);
                                iVar5 = QVariant::toInt((bool *)&args);
                                cVar2 = QTest::qCompare(iVar5,0,
                                                  "testModel.headerData(0, Qt::Horizontal).toInt()",
                                                  "0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x847);
                                QVariant::~QVariant((QVariant *)&args);
                                if (cVar2 != '\0') {
                                  GenericModel::headerData((int)&args,(Orientation)&testModel,1);
                                  iVar5 = QVariant::toInt((bool *)&args);
                                  cVar2 = QTest::qCompare(iVar5,1,
                                                  "testModel.headerData(1, Qt::Horizontal).toInt()",
                                                  "1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x848);
                                  QVariant::~QVariant((QVariant *)&args);
                                  if (cVar2 != '\0') {
                                    GenericModel::headerData((int)&args,(Orientation)&testModel,2);
                                    iVar5 = QVariant::toInt((bool *)&args);
                                    cVar2 = QTest::qCompare(iVar5,3,
                                                  "testModel.headerData(2, Qt::Horizontal).toInt()",
                                                  "3",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x849);
                                    QVariant::~QVariant((QVariant *)&args);
                                    if (cVar2 != '\0') {
                                      GenericModel::headerData((int)&args,(Orientation)&testModel,3)
                                      ;
                                      iVar5 = QVariant::toInt((bool *)&args);
                                      cVar2 = QTest::qCompare(iVar5,4,
                                                  "testModel.headerData(3, Qt::Horizontal).toInt()",
                                                  "4",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x84a);
                                      QVariant::~QVariant((QVariant *)&args);
                                      if (cVar2 != '\0') {
                                        GenericModel::headerData
                                                  ((int)&args,(Orientation)&testModel,4);
                                        iVar5 = QVariant::toInt((bool *)&args);
                                        cVar2 = QTest::qCompare(iVar5,5,
                                                  "testModel.headerData(4, Qt::Horizontal).toInt()",
                                                  "5",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x84b);
                                        QVariant::~QVariant((QVariant *)&args);
                                        if (cVar2 != '\0') {
                                          GenericModel::headerData
                                                    ((int)&args,(Orientation)&testModel,5);
                                          iVar5 = QVariant::toInt((bool *)&args);
                                          cVar2 = QTest::qCompare(iVar5,2,
                                                  "testModel.headerData(5, Qt::Horizontal).toInt()",
                                                  "2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x84c);
                                          QVariant::~QVariant((QVariant *)&args);
                                          if (cVar2 != '\0') {
                                            QPersistentModelIndex::data((int)&args);
                                            QVariant::toString();
                                            local_1b8.r = 0;
                                            local_1b8.c = 0;
                                            local_1b8.i = 0x14a994;
                                            local_1b8.m = (QAbstractItemModel *)0x3;
                                            local_188.d = (Data *)0x0;
                                            local_188.ptr = (char16_t *)0x0;
                                            local_188.size = 0;
                                            bVar4 = QTest::qCompare((QString *)&local_200,
                                                                    (QString *)&local_1b8,
                                                                    "oneTwoIndex.data().toString()",
                                                                    "QStringLiteral(\"1,2\")",
                                                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x84d);
                                            QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                      ((QArrayDataPointer<char16_t> *)&local_1b8);
                                            QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                      (&local_188);
                                            QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                      ((QArrayDataPointer<char16_t> *)&local_200);
                                            QVariant::~QVariant((QVariant *)&args);
                                            if (bVar4) {
                                              uVar6 = QPersistentModelIndex::column();
                                              pQVar7 = (QArrayDataPointer<QVariant> *)(ulong)uVar6;
                                              cVar2 = QTest::qCompare(uVar6,5,"oneTwoIndex.column()"
                                                                      ,"5",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x84e);
                                              if (cVar2 != '\0') {
                                                local_168 = 0;
                                                goto LAB_00127891;
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      break;
    }
  }
  goto LAB_00127a6e;
  while( true ) {
    QList<QList<QVariant>_>::takeFirst(&args,(QList<QList<QVariant>_> *)(lVar8 + 0x10));
    qvariant_cast<QModelIndex>(&local_200,args.d.ptr);
    bVar4 = true;
    if ((-1 < local_200.r) && (-1 < (long)local_200._0_8_)) {
      bVar4 = local_200.m == (QAbstractItemModel *)0x0;
    }
    cVar2 = QTest::qVerify(bVar4,"!args.at(0).value<QModelIndex>().isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                           ,0x852);
    if (cVar2 == '\0') goto LAB_00127a64;
    iVar5 = QVariant::toInt((bool *)(args.d.ptr + 1));
    cVar2 = QTest::qCompare(iVar5,2,"args.at(1).toInt()","2",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x853);
    if (cVar2 == '\0') goto LAB_00127a64;
    iVar5 = QVariant::toInt((bool *)(args.d.ptr + 2));
    cVar2 = QTest::qCompare(iVar5,2,"args.at(2).toInt()","2",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x854);
    if (cVar2 == '\0') goto LAB_00127a64;
    qvariant_cast<QModelIndex>(&local_200,args.d.ptr + 3);
    bVar4 = true;
    if ((-1 < local_200.r) && (-1 < (long)local_200._0_8_)) {
      bVar4 = local_200.m == (QAbstractItemModel *)0x0;
    }
    cVar2 = QTest::qVerify(bVar4,"!args.at(3).value<QModelIndex>().isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                           ,0x855);
    if (cVar2 == '\0') goto LAB_00127a64;
    iVar5 = QVariant::toInt((bool *)(args.d.ptr + 4));
    cVar2 = QTest::qCompare(iVar5,6,"args.at(4).toInt()","6",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x856);
    pQVar7 = &args.d;
    QArrayDataPointer<QVariant>::~QArrayDataPointer(pQVar7);
    local_168 = local_168 + 8;
    if (cVar2 == '\0') break;
LAB_00127891:
    if (local_168 == 0x10) {
      args.d.d = (Data *)0xffffffffffffffff;
      args.d.ptr = (QVariant *)0x0;
      args.d.size = 0;
      fillTable((tst_GenericModel *)pQVar7,(QAbstractItemModel *)&testModel,2,6,(QModelIndex *)&args
                ,0);
      local_200.r = -1;
      local_200.c = -1;
      local_200.i = 0;
      local_200.m = (QAbstractItemModel *)0x0;
      GenericModel::index((int)&args,(int)&testModel,(QModelIndex *)0x1);
      QPersistentModelIndex::QPersistentModelIndex(&oneOneIndex,(QModelIndex *)&args);
      args.d.d = (Data *)0xffffffffffffffff;
      args.d.ptr = (QVariant *)0x0;
      args.d.size = 0;
      local_200.r = -1;
      local_200.c = -1;
      local_200.i = 0;
      local_200.m = (QAbstractItemModel *)0x0;
      bVar4 = (bool)GenericModel::moveColumns
                              ((QModelIndex *)&testModel,(int)&args,0,(QModelIndex *)0x2,
                               (int)&local_200);
      cVar2 = QTest::qVerify(bVar4,"testModel.moveColumns(QModelIndex(), 0, 2, QModelIndex(), 3)",""
                             ,
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x85b);
      if (cVar2 == '\0') goto LAB_001289d2;
      local_188.d = (Data *)0xffffffffffffffff;
      local_188.ptr = (char16_t *)0x0;
      local_188.size = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x0);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      QVariant::toString();
      local_1d0.d = (Data *)0x0;
      local_1d0.ptr = L"0,2";
      local_1d0.size = 3;
      local_1e8.d = (Data *)0x0;
      local_1e8.ptr = (char16_t *)0x0;
      local_1e8.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                              "testModel.index(0, 0).data().toString()","QStringLiteral(\"0,2\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x85c);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_200);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_001289d2;
      local_188.d = (Data *)0xffffffffffffffff;
      local_188.ptr = (char16_t *)0x0;
      local_188.size = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x0);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      QVariant::toString();
      local_1d0.d = (Data *)0x0;
      local_1d0.ptr = L"0,0";
      local_1d0.size = 3;
      local_1e8.d = (Data *)0x0;
      local_1e8.ptr = (char16_t *)0x0;
      local_1e8.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                              "testModel.index(0, 1).data().toString()","QStringLiteral(\"0,0\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x85d);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_200);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_001289d2;
      local_188.d = (Data *)0xffffffffffffffff;
      local_188.ptr = (char16_t *)0x0;
      local_188.size = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x0);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      QVariant::toString();
      local_1d0.d = (Data *)0x0;
      local_1d0.ptr = L"0,1";
      local_1d0.size = 3;
      local_1e8.d = (Data *)0x0;
      local_1e8.ptr = (char16_t *)0x0;
      local_1e8.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                              "testModel.index(0, 2).data().toString()","QStringLiteral(\"0,1\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x85e);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_200);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_001289d2;
      local_188.d = (Data *)0xffffffffffffffff;
      local_188.ptr = (char16_t *)0x0;
      local_188.size = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x0);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      QVariant::toString();
      local_1d0.d = (Data *)0x0;
      local_1d0.ptr = L"0,3";
      local_1d0.size = 3;
      local_1e8.d = (Data *)0x0;
      local_1e8.ptr = (char16_t *)0x0;
      local_1e8.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                              "testModel.index(0, 3).data().toString()","QStringLiteral(\"0,3\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x85f);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_200);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_001289d2;
      local_188.d = (Data *)0xffffffffffffffff;
      local_188.ptr = (char16_t *)0x0;
      local_188.size = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x0);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      QVariant::toString();
      local_1d0.d = (Data *)0x0;
      local_1d0.ptr = L"0,4";
      local_1d0.size = 3;
      local_1e8.d = (Data *)0x0;
      local_1e8.ptr = (char16_t *)0x0;
      local_1e8.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                              "testModel.index(0, 4).data().toString()","QStringLiteral(\"0,4\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x860);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_200);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_001289d2;
      local_188.d = (Data *)0xffffffffffffffff;
      local_188.ptr = (char16_t *)0x0;
      local_188.size = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x0);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      QVariant::toString();
      local_1d0.d = (Data *)0x0;
      local_1d0.ptr = L"0,5";
      local_1d0.size = 3;
      local_1e8.d = (Data *)0x0;
      local_1e8.ptr = (char16_t *)0x0;
      local_1e8.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                              "testModel.index(0, 5).data().toString()","QStringLiteral(\"0,5\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x861);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_200);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_001289d2;
      local_188.d = (Data *)0xffffffffffffffff;
      local_188.ptr = (char16_t *)0x0;
      local_188.size = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x1);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      QVariant::toString();
      local_1d0.d = (Data *)0x0;
      local_1d0.ptr = L"1,2";
      local_1d0.size = 3;
      local_1e8.d = (Data *)0x0;
      local_1e8.ptr = (char16_t *)0x0;
      local_1e8.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                              "testModel.index(1, 0).data().toString()","QStringLiteral(\"1,2\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x862);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_200);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_001289d2;
      local_188.d = (Data *)0xffffffffffffffff;
      local_188.ptr = (char16_t *)0x0;
      local_188.size = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x1);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      QVariant::toString();
      local_1d0.d = (Data *)0x0;
      local_1d0.ptr = L"1,0";
      local_1d0.size = 3;
      local_1e8.d = (Data *)0x0;
      local_1e8.ptr = (char16_t *)0x0;
      local_1e8.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                              "testModel.index(1, 1).data().toString()","QStringLiteral(\"1,0\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x863);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_200);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_001289d2;
      local_188.d = (Data *)0xffffffffffffffff;
      local_188.ptr = (char16_t *)0x0;
      local_188.size = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x1);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      QVariant::toString();
      local_1d0.d = (Data *)0x0;
      local_1d0.ptr = L"1,1";
      local_1d0.size = 3;
      local_1e8.d = (Data *)0x0;
      local_1e8.ptr = (char16_t *)0x0;
      local_1e8.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                              "testModel.index(1, 2).data().toString()","QStringLiteral(\"1,1\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x864);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_200);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_001289d2;
      local_188.d = (Data *)0xffffffffffffffff;
      local_188.ptr = (char16_t *)0x0;
      local_188.size = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x1);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      QVariant::toString();
      local_1d0.d = (Data *)0x0;
      local_1d0.ptr = L"1,3";
      local_1d0.size = 3;
      local_1e8.d = (Data *)0x0;
      local_1e8.ptr = (char16_t *)0x0;
      local_1e8.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                              "testModel.index(1, 3).data().toString()","QStringLiteral(\"1,3\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x865);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_200);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_001289d2;
      local_188.d = (Data *)0xffffffffffffffff;
      local_188.ptr = (char16_t *)0x0;
      local_188.size = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x1);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      QVariant::toString();
      local_1d0.d = (Data *)0x0;
      local_1d0.ptr = L"1,4";
      local_1d0.size = 3;
      local_1e8.d = (Data *)0x0;
      local_1e8.ptr = (char16_t *)0x0;
      local_1e8.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                              "testModel.index(1, 4).data().toString()","QStringLiteral(\"1,4\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x866);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_200);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_001289d2;
      local_188.d = (Data *)0xffffffffffffffff;
      local_188.ptr = (char16_t *)0x0;
      local_188.size = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x1);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      QVariant::toString();
      local_1d0.d = (Data *)0x0;
      local_1d0.ptr = L"1,5";
      local_1d0.size = 3;
      local_1e8.d = (Data *)0x0;
      local_1e8.ptr = (char16_t *)0x0;
      local_1e8.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1d0,
                              "testModel.index(1, 5).data().toString()","QStringLiteral(\"1,5\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x867);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_200);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_001289d2;
      GenericModel::headerData((int)&args,(Orientation)&testModel,0);
      iVar5 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar5,2,"testModel.headerData(0, Qt::Horizontal).toInt()","2",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x868);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_001289d2;
      GenericModel::headerData((int)&args,(Orientation)&testModel,1);
      iVar5 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar5,0,"testModel.headerData(1, Qt::Horizontal).toInt()","0",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x869);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_001289d2;
      GenericModel::headerData((int)&args,(Orientation)&testModel,2);
      iVar5 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar5,1,"testModel.headerData(2, Qt::Horizontal).toInt()","1",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x86a);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_001289d2;
      GenericModel::headerData((int)&args,(Orientation)&testModel,3);
      iVar5 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar5,3,"testModel.headerData(3, Qt::Horizontal).toInt()","3",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x86b);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_001289d2;
      GenericModel::headerData((int)&args,(Orientation)&testModel,4);
      iVar5 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar5,4,"testModel.headerData(4, Qt::Horizontal).toInt()","4",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x86c);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_001289d2;
      GenericModel::headerData((int)&args,(Orientation)&testModel,5);
      iVar5 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar5,5,"testModel.headerData(5, Qt::Horizontal).toInt()","5",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x86d);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_001289d2;
      QPersistentModelIndex::data((int)&args);
      QVariant::toString();
      local_1b8.r = 0;
      local_1b8.c = 0;
      local_1b8.i = 0x14a984;
      local_1b8.m = (QAbstractItemModel *)0x3;
      local_188.d = (Data *)0x0;
      local_188.ptr = (char16_t *)0x0;
      local_188.size = 0;
      bVar4 = QTest::qCompare((QString *)&local_200,(QString *)&local_1b8,
                              "oneOneIndex.data().toString()","QStringLiteral(\"1,1\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x86e);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_188);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_200);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_001289d2;
      iVar5 = QPersistentModelIndex::column();
      cVar2 = QTest::qCompare(iVar5,2,"oneOneIndex.column()","2",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x86f);
      if (cVar2 == '\0') goto LAB_001289d2;
      lVar8 = 0;
      goto LAB_00128830;
    }
    lVar8 = *(long *)((long)spyArr + local_168);
    cVar2 = QTest::qCompare(*(longlong *)(lVar8 + 0x20),1,"spy->count()","1",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x850);
    if (cVar2 == '\0') break;
  }
  goto LAB_00127a6e;
LAB_00127a64:
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&args.d);
  goto LAB_00127a6e;
LAB_00128830:
  do {
    if (lVar8 == 0x10) break;
    lVar1 = *(long *)((long)spyArr + lVar8);
    cVar2 = QTest::qCompare(*(longlong *)(lVar1 + 0x20),1,"spy->count()","1",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x871);
    if (cVar2 == '\0') break;
    QList<QList<QVariant>_>::takeFirst
              ((value_type *)&args.d,(QList<QList<QVariant>_> *)(lVar1 + 0x10));
    qvariant_cast<QModelIndex>(&local_200,args.d.ptr);
    bVar4 = true;
    if ((-1 < local_200.r) && (-1 < (long)local_200._0_8_)) {
      bVar4 = local_200.m == (QAbstractItemModel *)0x0;
    }
    cVar2 = QTest::qVerify(bVar4,"!args.at(0).value<QModelIndex>().isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                           ,0x873);
    if (cVar2 == '\0') {
LAB_001289c8:
      QArrayDataPointer<QVariant>::~QArrayDataPointer(&args.d);
      break;
    }
    iVar5 = QVariant::toInt((bool *)(args.d.ptr + 1));
    cVar2 = QTest::qCompare(iVar5,0,"args.at(1).toInt()","0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x874);
    if (cVar2 == '\0') goto LAB_001289c8;
    iVar5 = QVariant::toInt((bool *)(args.d.ptr + 2));
    cVar2 = QTest::qCompare(iVar5,1,"args.at(2).toInt()","1",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x875);
    if (cVar2 == '\0') goto LAB_001289c8;
    qvariant_cast<QModelIndex>(&local_200,args.d.ptr + 3);
    bVar4 = true;
    if ((-1 < local_200.r) && (-1 < (long)local_200._0_8_)) {
      bVar4 = local_200.m == (QAbstractItemModel *)0x0;
    }
    cVar2 = QTest::qVerify(bVar4,"!args.at(3).value<QModelIndex>().isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                           ,0x876);
    if (cVar2 == '\0') goto LAB_001289c8;
    iVar5 = QVariant::toInt((bool *)(args.d.ptr + 4));
    cVar2 = QTest::qCompare(iVar5,3,"args.at(4).toInt()","3",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x877);
    QArrayDataPointer<QVariant>::~QArrayDataPointer(&args.d);
    lVar8 = lVar8 + 8;
  } while (cVar2 != '\0');
LAB_001289d2:
  QPersistentModelIndex::~QPersistentModelIndex(&oneOneIndex);
LAB_00127a6e:
  QPersistentModelIndex::~QPersistentModelIndex(&oneTwoIndex);
LAB_00127a7b:
  QSignalSpy::~QSignalSpy(&columnsMovedSpy);
LAB_00127a88:
  QSignalSpy::~QSignalSpy(&rowsAboutToBeMovedSpy);
  QObject::~QObject((QObject *)&probe);
  GenericModel::~GenericModel(&testModel);
  return;
}

Assistant:

void tst_GenericModel::moveColumnsTable()
{
    GenericModel testModel;
    ModelTest probe(&testModel, nullptr);
    fillTable(&testModel, 2, 6);

    QSignalSpy rowsAboutToBeMovedSpy(&testModel, SIGNAL(columnsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(rowsAboutToBeMovedSpy.isValid());
    QSignalSpy columnsMovedSpy(&testModel, SIGNAL(columnsMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(columnsMovedSpy.isValid());
    QSignalSpy *spyArr[] = {&rowsAboutToBeMovedSpy, &columnsMovedSpy};

    QVERIFY(!testModel.moveColumns(QModelIndex(), 2, 1, QModelIndex(), -1));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveColumns(QModelIndex(), 2, 1, QModelIndex(), 7));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveColumns(QModelIndex(), -1, 1, QModelIndex(), 3));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveColumns(QModelIndex(), 6, 1, QModelIndex(), 3));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveColumns(QModelIndex(), 1, 2, QModelIndex(), 2));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveColumns(QModelIndex(), 1, 2, QModelIndex(), 3));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);

    QPersistentModelIndex oneTwoIndex = testModel.index(1, 2);
    QVERIFY(testModel.moveColumns(QModelIndex(), 2, 1, QModelIndex(), 4));
    QCOMPARE(testModel.index(0, 0).data().toString(), QStringLiteral("0,0"));
    QCOMPARE(testModel.index(0, 1).data().toString(), QStringLiteral("0,1"));
    QCOMPARE(testModel.index(0, 2).data().toString(), QStringLiteral("0,3"));
    QCOMPARE(testModel.index(0, 3).data().toString(), QStringLiteral("0,2"));
    QCOMPARE(testModel.index(0, 4).data().toString(), QStringLiteral("0,4"));
    QCOMPARE(testModel.index(0, 5).data().toString(), QStringLiteral("0,5"));
    QCOMPARE(testModel.index(1, 0).data().toString(), QStringLiteral("1,0"));
    QCOMPARE(testModel.index(1, 1).data().toString(), QStringLiteral("1,1"));
    QCOMPARE(testModel.index(1, 2).data().toString(), QStringLiteral("1,3"));
    QCOMPARE(testModel.index(1, 3).data().toString(), QStringLiteral("1,2"));
    QCOMPARE(testModel.index(1, 4).data().toString(), QStringLiteral("1,4"));
    QCOMPARE(testModel.index(1, 5).data().toString(), QStringLiteral("1,5"));
    QCOMPARE(testModel.headerData(0, Qt::Horizontal).toInt(), 0);
    QCOMPARE(testModel.headerData(1, Qt::Horizontal).toInt(), 1);
    QCOMPARE(testModel.headerData(2, Qt::Horizontal).toInt(), 3);
    QCOMPARE(testModel.headerData(3, Qt::Horizontal).toInt(), 2);
    QCOMPARE(testModel.headerData(4, Qt::Horizontal).toInt(), 4);
    QCOMPARE(testModel.headerData(5, Qt::Horizontal).toInt(), 5);
    QCOMPARE(oneTwoIndex.data().toString(), QStringLiteral("1,2"));
    QCOMPARE(oneTwoIndex.column(), 3);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QVERIFY(!args.at(0).value<QModelIndex>().isValid());
        QCOMPARE(args.at(1).toInt(), 2);
        QCOMPARE(args.at(2).toInt(), 2);
        QVERIFY(!args.at(3).value<QModelIndex>().isValid());
        QCOMPARE(args.at(4).toInt(), 4);
    }

    fillTable(&testModel, 2, 6);
    oneTwoIndex = testModel.index(1, 2);
    QVERIFY(testModel.moveColumns(QModelIndex(), 2, 1, QModelIndex(), 0));
    QCOMPARE(testModel.index(0, 0).data().toString(), QStringLiteral("0,2"));
    QCOMPARE(testModel.index(0, 1).data().toString(), QStringLiteral("0,0"));
    QCOMPARE(testModel.index(0, 2).data().toString(), QStringLiteral("0,1"));
    QCOMPARE(testModel.index(0, 3).data().toString(), QStringLiteral("0,3"));
    QCOMPARE(testModel.index(0, 4).data().toString(), QStringLiteral("0,4"));
    QCOMPARE(testModel.index(0, 5).data().toString(), QStringLiteral("0,5"));
    QCOMPARE(testModel.index(1, 0).data().toString(), QStringLiteral("1,2"));
    QCOMPARE(testModel.index(1, 1).data().toString(), QStringLiteral("1,0"));
    QCOMPARE(testModel.index(1, 2).data().toString(), QStringLiteral("1,1"));
    QCOMPARE(testModel.index(1, 3).data().toString(), QStringLiteral("1,3"));
    QCOMPARE(testModel.index(1, 4).data().toString(), QStringLiteral("1,4"));
    QCOMPARE(testModel.index(1, 5).data().toString(), QStringLiteral("1,5"));
    QCOMPARE(testModel.headerData(0, Qt::Horizontal).toInt(), 2);
    QCOMPARE(testModel.headerData(1, Qt::Horizontal).toInt(), 0);
    QCOMPARE(testModel.headerData(2, Qt::Horizontal).toInt(), 1);
    QCOMPARE(testModel.headerData(3, Qt::Horizontal).toInt(), 3);
    QCOMPARE(testModel.headerData(4, Qt::Horizontal).toInt(), 4);
    QCOMPARE(testModel.headerData(5, Qt::Horizontal).toInt(), 5);
    QCOMPARE(oneTwoIndex.data().toString(), QStringLiteral("1,2"));
    QCOMPARE(oneTwoIndex.column(), 0);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QVERIFY(!args.at(0).value<QModelIndex>().isValid());
        QCOMPARE(args.at(1).toInt(), 2);
        QCOMPARE(args.at(2).toInt(), 2);
        QVERIFY(!args.at(3).value<QModelIndex>().isValid());
        QCOMPARE(args.at(4).toInt(), 0);
    }

    fillTable(&testModel, 2, 6);
    oneTwoIndex = testModel.index(1, 2);
    QVERIFY(testModel.moveColumns(QModelIndex(), 2, 1, QModelIndex(), 6));
    QCOMPARE(testModel.index(0, 0).data().toString(), QStringLiteral("0,0"));
    QCOMPARE(testModel.index(0, 1).data().toString(), QStringLiteral("0,1"));
    QCOMPARE(testModel.index(0, 2).data().toString(), QStringLiteral("0,3"));
    QCOMPARE(testModel.index(0, 3).data().toString(), QStringLiteral("0,4"));
    QCOMPARE(testModel.index(0, 4).data().toString(), QStringLiteral("0,5"));
    QCOMPARE(testModel.index(0, 5).data().toString(), QStringLiteral("0,2"));
    QCOMPARE(testModel.index(1, 0).data().toString(), QStringLiteral("1,0"));
    QCOMPARE(testModel.index(1, 1).data().toString(), QStringLiteral("1,1"));
    QCOMPARE(testModel.index(1, 2).data().toString(), QStringLiteral("1,3"));
    QCOMPARE(testModel.index(1, 3).data().toString(), QStringLiteral("1,4"));
    QCOMPARE(testModel.index(1, 4).data().toString(), QStringLiteral("1,5"));
    QCOMPARE(testModel.index(1, 5).data().toString(), QStringLiteral("1,2"));
    QCOMPARE(testModel.headerData(0, Qt::Horizontal).toInt(), 0);
    QCOMPARE(testModel.headerData(1, Qt::Horizontal).toInt(), 1);
    QCOMPARE(testModel.headerData(2, Qt::Horizontal).toInt(), 3);
    QCOMPARE(testModel.headerData(3, Qt::Horizontal).toInt(), 4);
    QCOMPARE(testModel.headerData(4, Qt::Horizontal).toInt(), 5);
    QCOMPARE(testModel.headerData(5, Qt::Horizontal).toInt(), 2);
    QCOMPARE(oneTwoIndex.data().toString(), QStringLiteral("1,2"));
    QCOMPARE(oneTwoIndex.column(), 5);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QVERIFY(!args.at(0).value<QModelIndex>().isValid());
        QCOMPARE(args.at(1).toInt(), 2);
        QCOMPARE(args.at(2).toInt(), 2);
        QVERIFY(!args.at(3).value<QModelIndex>().isValid());
        QCOMPARE(args.at(4).toInt(), 6);
    }

    fillTable(&testModel, 2, 6);
    QPersistentModelIndex oneOneIndex = testModel.index(1, 1);
    QVERIFY(testModel.moveColumns(QModelIndex(), 0, 2, QModelIndex(), 3));
    QCOMPARE(testModel.index(0, 0).data().toString(), QStringLiteral("0,2"));
    QCOMPARE(testModel.index(0, 1).data().toString(), QStringLiteral("0,0"));
    QCOMPARE(testModel.index(0, 2).data().toString(), QStringLiteral("0,1"));
    QCOMPARE(testModel.index(0, 3).data().toString(), QStringLiteral("0,3"));
    QCOMPARE(testModel.index(0, 4).data().toString(), QStringLiteral("0,4"));
    QCOMPARE(testModel.index(0, 5).data().toString(), QStringLiteral("0,5"));
    QCOMPARE(testModel.index(1, 0).data().toString(), QStringLiteral("1,2"));
    QCOMPARE(testModel.index(1, 1).data().toString(), QStringLiteral("1,0"));
    QCOMPARE(testModel.index(1, 2).data().toString(), QStringLiteral("1,1"));
    QCOMPARE(testModel.index(1, 3).data().toString(), QStringLiteral("1,3"));
    QCOMPARE(testModel.index(1, 4).data().toString(), QStringLiteral("1,4"));
    QCOMPARE(testModel.index(1, 5).data().toString(), QStringLiteral("1,5"));
    QCOMPARE(testModel.headerData(0, Qt::Horizontal).toInt(), 2);
    QCOMPARE(testModel.headerData(1, Qt::Horizontal).toInt(), 0);
    QCOMPARE(testModel.headerData(2, Qt::Horizontal).toInt(), 1);
    QCOMPARE(testModel.headerData(3, Qt::Horizontal).toInt(), 3);
    QCOMPARE(testModel.headerData(4, Qt::Horizontal).toInt(), 4);
    QCOMPARE(testModel.headerData(5, Qt::Horizontal).toInt(), 5);
    QCOMPARE(oneOneIndex.data().toString(), QStringLiteral("1,1"));
    QCOMPARE(oneOneIndex.column(), 2);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QVERIFY(!args.at(0).value<QModelIndex>().isValid());
        QCOMPARE(args.at(1).toInt(), 0);
        QCOMPARE(args.at(2).toInt(), 1);
        QVERIFY(!args.at(3).value<QModelIndex>().isValid());
        QCOMPARE(args.at(4).toInt(), 3);
    }
}